

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEra.c
# Opt level: O0

void Gia_ManSimulateNode(Gia_ManEra_t *p,Gia_Obj_t *pObj)

{
  int iVar1;
  int i;
  uint *puVar2;
  uint *puVar3;
  uint *puVar4;
  int local_3c;
  int w;
  uint *pInfo1;
  uint *pInfo0;
  uint *pInfo;
  int Id;
  Gia_Obj_t *pObj_local;
  Gia_ManEra_t *p_local;
  
  iVar1 = Gia_ObjId(p->pAig,pObj);
  puVar2 = Gia_ManEraData(p,iVar1);
  i = Gia_ObjFaninId0(pObj,iVar1);
  puVar3 = Gia_ManEraData(p,i);
  iVar1 = Gia_ObjFaninId1(pObj,iVar1);
  puVar4 = Gia_ManEraData(p,iVar1);
  iVar1 = Gia_ObjFaninC0(pObj);
  if (iVar1 == 0) {
    iVar1 = Gia_ObjFaninC1(pObj);
    if (iVar1 == 0) {
      local_3c = p->nWordsSim;
      while (local_3c = local_3c + -1, -1 < local_3c) {
        puVar2[local_3c] = puVar3[local_3c] & puVar4[local_3c];
      }
    }
    else {
      local_3c = p->nWordsSim;
      while (local_3c = local_3c + -1, -1 < local_3c) {
        puVar2[local_3c] = puVar3[local_3c] & (puVar4[local_3c] ^ 0xffffffff);
      }
    }
  }
  else {
    iVar1 = Gia_ObjFaninC1(pObj);
    if (iVar1 == 0) {
      local_3c = p->nWordsSim;
      while (local_3c = local_3c + -1, -1 < local_3c) {
        puVar2[local_3c] = (puVar3[local_3c] ^ 0xffffffff) & puVar4[local_3c];
      }
    }
    else {
      local_3c = p->nWordsSim;
      while (local_3c = local_3c + -1, -1 < local_3c) {
        puVar2[local_3c] = (puVar3[local_3c] | puVar4[local_3c]) ^ 0xffffffff;
      }
    }
  }
  return;
}

Assistant:

static inline void Gia_ManSimulateNode( Gia_ManEra_t * p, Gia_Obj_t * pObj )
{
    int Id = Gia_ObjId(p->pAig, pObj);
    unsigned * pInfo  = Gia_ManEraData( p, Id );
    unsigned * pInfo0 = Gia_ManEraData( p, Gia_ObjFaninId0(pObj, Id) );
    unsigned * pInfo1 = Gia_ManEraData( p, Gia_ObjFaninId1(pObj, Id) );
    int w;
    if ( Gia_ObjFaninC0(pObj) )
    {
        if (  Gia_ObjFaninC1(pObj) )
            for ( w = p->nWordsSim-1; w >= 0; w-- )
                pInfo[w] = ~(pInfo0[w] | pInfo1[w]);
        else 
            for ( w = p->nWordsSim-1; w >= 0; w-- )
                pInfo[w] = ~pInfo0[w] & pInfo1[w];
    }
    else 
    {
        if (  Gia_ObjFaninC1(pObj) )
            for ( w = p->nWordsSim-1; w >= 0; w-- )
                pInfo[w] = pInfo0[w] & ~pInfo1[w];
        else 
            for ( w = p->nWordsSim-1; w >= 0; w-- )
                pInfo[w] = pInfo0[w] & pInfo1[w];
    }
}